

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrettyPrinter.cpp
# Opt level: O2

void __thiscall hdc::PrettyPrinter::visit(PrettyPrinter *this,IfStatement *statement)

{
  _func_int *UNRECOVERED_JUMPTABLE;
  Expression *pEVar1;
  CompoundStatement *pCVar2;
  ElifStatement *pEVar3;
  ElseStatement *pEVar4;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar5;
  
  std::operator<<((ostream *)&this->field_0x20,"if ");
  pEVar1 = IfStatement::getExpression(statement);
  (**(pEVar1->super_Statement).super_ASTNode._vptr_ASTNode)(pEVar1,this);
  std::operator<<((ostream *)&this->field_0x20,":\n");
  this->n_spaces = this->n_spaces + 1;
  pCVar2 = IfStatement::getStatements(statement);
  (**(pCVar2->super_Statement).super_ASTNode._vptr_ASTNode)(pCVar2,this);
  this->n_spaces = this->n_spaces + -1;
  pEVar3 = IfStatement::getElifStatement(statement);
  if (pEVar3 == (ElifStatement *)0x0) {
    pEVar4 = IfStatement::getElseStatement(statement);
    if (pEVar4 == (ElseStatement *)0x0) {
      return;
    }
    pEVar3 = (ElifStatement *)IfStatement::getElseStatement(statement);
    uVar5 = extraout_RDX_00;
  }
  else {
    pEVar3 = IfStatement::getElifStatement(statement);
    uVar5 = extraout_RDX;
  }
  UNRECOVERED_JUMPTABLE = *(pEVar3->super_Statement).super_ASTNode._vptr_ASTNode;
  (*UNRECOVERED_JUMPTABLE)(pEVar3,this,uVar5,UNRECOVERED_JUMPTABLE);
  return;
}

Assistant:

void PrettyPrinter::visit(IfStatement* statement) {
    output << "if ";
    statement->getExpression()->accept(this);
    output << ":\n";
    indent();
    statement->getStatements()->accept(this);
    dedent();

    if (statement->getElifStatement()) {
        statement->getElifStatement()->accept(this);
    } else if (statement->getElseStatement()) {
        statement->getElseStatement()->accept(this);
    }
}